

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O2

void __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
::computeMinMax(KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
                *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
                      *obj,Offset ind,Size count,Dimension element,ElementType *min_elem,
               ElementType *max_elem)

{
  Offset i;
  ulong uVar1;
  float fVar2;
  
  fVar2 = eos::fitting::
          KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>
          ::kdtree_get_pt(obj->dataset,
                          (this->vAcc).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[ind],element);
  *min_elem = fVar2;
  *max_elem = fVar2;
  for (uVar1 = 1; uVar1 < count; uVar1 = uVar1 + 1) {
    fVar2 = eos::fitting::
            KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>
            ::kdtree_get_pt(obj->dataset,
                            (this->vAcc).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[ind + uVar1],element);
    if (fVar2 < *min_elem) {
      *min_elem = fVar2;
    }
    if (*max_elem <= fVar2 && fVar2 != *max_elem) {
      *max_elem = fVar2;
    }
  }
  return;
}

Assistant:

void computeMinMax(
        const Derived& obj, Offset ind, Size count, Dimension element,
        ElementType& min_elem, ElementType& max_elem)
    {
        min_elem = dataset_get(obj, vAcc[ind], element);
        max_elem = min_elem;
        for (Offset i = 1; i < count; ++i)
        {
            ElementType val = dataset_get(obj, vAcc[ind + i], element);
            if (val < min_elem) min_elem = val;
            if (val > max_elem) max_elem = val;
        }
    }